

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemFireFightingFactored.cpp
# Opt level: O0

double __thiscall
ProblemFireFightingFactored::ComputeTransitionProb
          (ProblemFireFightingFactored *this,Index y,Index yVal,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *Xs,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *As,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *Ys)

{
  undefined8 uVar1;
  const_reference pvVar2;
  E *pEVar3;
  ulong uVar4;
  size_type sVar5;
  unsigned_long *puVar6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RCX;
  uint in_EDX;
  uint in_ESI;
  long *in_RDI;
  undefined8 in_R8;
  double p2;
  Index lowerLevel;
  string *in_stack_00000068;
  Index higherLevel;
  Index sameLevel;
  Index xI;
  bool neighborIsBurning;
  size_t nrAgentsAtLocation;
  Index nextLevel;
  Index curLevel;
  Index Index_of_hI_within_scope;
  Scope *XSoI;
  Index hI;
  undefined4 in_stack_fffffffffffffeb8;
  Index in_stack_fffffffffffffebc;
  MultiAgentDecisionProcessDiscreteFactoredStates *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  uint uVar7;
  char *in_stack_fffffffffffffee8;
  E *in_stack_fffffffffffffef0;
  undefined7 in_stack_fffffffffffffef8;
  undefined1 uVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  double local_f0;
  unsigned_long local_e0;
  unsigned_long local_d8;
  uint local_cc;
  uint local_c8;
  byte local_c1;
  long local_c0;
  uint local_b4;
  value_type local_b0;
  undefined1 local_aa;
  uint local_44;
  Scope *local_40;
  value_type local_38;
  undefined8 local_20;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_18;
  uint local_10;
  
  if ((ulong)in_RDI[0xe2] <= (ulong)in_ESI) {
    uVar1 = __cxa_allocate_exception(0x28);
    E::E(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    __cxa_throw(uVar1,&E::typeinfo,E::~E);
  }
  local_38 = in_ESI;
  local_20 = in_R8;
  local_18 = in_RCX;
  local_10 = in_EDX;
  local_40 = MultiAgentDecisionProcessDiscreteFactoredStates::GetXSoI_Y
                       (in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
  local_44 = 0;
  while( true ) {
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&local_40->super_SDT,(ulong)local_44);
    uVar8 = false;
    if (*pvVar2 != local_38) {
      in_stack_fffffffffffffef0 = (E *)(ulong)local_44;
      pEVar3 = (E *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                              (&local_40->super_SDT);
      uVar8 = in_stack_fffffffffffffef0 < pEVar3;
    }
    if ((bool)uVar8 == false) break;
    local_44 = local_44 + 1;
  }
  uVar4 = (ulong)local_44;
  sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_40->super_SDT);
  if (uVar4 == sVar5) {
    local_aa = 1;
    uVar1 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff00,(char *)CONCAT17(uVar8,in_stack_fffffffffffffef8),
               (allocator<char> *)in_stack_fffffffffffffef0);
    StringTools::Append(in_stack_00000068,lowerLevel);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                   (char *)in_stack_fffffffffffffec0);
    E::E((E *)in_stack_fffffffffffffec0,
         (string *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    local_aa = 0;
    __cxa_throw(uVar1,&E::typeinfo,E::~E);
  }
  pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      in_stack_fffffffffffffec0,
                      CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  local_b0 = *pvVar2;
  local_b4 = local_10;
  local_c0 = (**(code **)(*in_RDI + 800))(in_RDI,local_20,local_38);
  local_c1 = 0;
  for (local_c8 = 0; uVar4 = (ulong)local_c8,
      sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_18),
      uVar4 < sVar5; local_c8 = local_c8 + 1) {
    if ((local_c8 != local_44) &&
       (pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            in_stack_fffffffffffffec0,
                            CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8)),
       *pvVar2 != 0)) {
      local_c1 = 1;
    }
  }
  local_cc = local_b0;
  local_d8 = (ulong)local_b0 + 1;
  local_e0 = in_RDI[0xe3] - 1;
  puVar6 = std::min<unsigned_long>(&local_d8,&local_e0);
  if (local_b0 == 0) {
    uVar7 = 0;
  }
  else {
    uVar7 = local_b0 - 1;
  }
  local_f0 = 0.0;
  if (local_c0 == 0) {
    if ((local_c1 & 1) == 0) {
      if (local_b0 == 0) {
        if (local_b4 == 0) {
          local_f0 = 1.0;
        }
        else {
          local_f0 = 0.0;
        }
      }
      else {
        if (local_b4 == local_cc) {
          local_f0 = 0.6;
        }
        if (local_b4 == (uint)*puVar6) {
          local_f0 = local_f0 + 0.4;
        }
      }
    }
    else {
      if (local_b4 == local_cc) {
        local_f0 = 0.2;
      }
      if (local_b4 == (uint)*puVar6) {
        local_f0 = local_f0 + 0.8;
      }
    }
  }
  else if (local_c0 == 1) {
    if ((local_c1 & 1) == 0) {
      if (local_b0 == 0) {
        if (local_b4 == 0) {
          local_f0 = 1.0;
        }
        else {
          local_f0 = 0.0;
        }
      }
      else {
        local_f0 = 0.0;
        if (local_b4 == uVar7) {
          local_f0 = 1.0;
        }
      }
    }
    else {
      if (local_b4 == local_cc) {
        local_f0 = 0.4;
      }
      if (local_b4 == uVar7) {
        local_f0 = local_f0 + 0.6;
      }
    }
  }
  else if (local_b4 == 0) {
    local_f0 = 1.0;
  }
  else {
    local_f0 = 0.0;
  }
  return local_f0;
}

Assistant:

double ProblemFireFightingFactored::ComputeTransitionProb(
            Index y,
            Index yVal,
            const std::vector< Index>& Xs,
            const std::vector< Index>& As,
            const std::vector< Index>& Ys
        ) const
{
    if(y >= _m_nrHouses)
        throw E("position sfac transition probs NYI");

    //this computes the probability P( nextLevel | ...) for hI
    Index hI = y;

    const Scope& XSoI = GetXSoI_Y(y);
    Index Index_of_hI_within_scope = 0;
    while(XSoI[Index_of_hI_within_scope] != hI &&
            Index_of_hI_within_scope < XSoI.size() )
        Index_of_hI_within_scope++;

    if(Index_of_hI_within_scope == XSoI.size())
        throw E( StringTools::Append("did not find this house (hI=",hI) +
                " in its own scope of influence XSoI)" );

    Index curLevel = Xs.at(Index_of_hI_within_scope);
    Index nextLevel = yVal;
    size_t nrAgentsAtLocation=GetNrAgentsAtHouse(As,hI);

#if 0 && DEBUG_CTM
    cout << "hI="<<hI<<" #agents="<<nrAgentsAtLocation << " ";
#endif
    bool neighborIsBurning = false;
    for(Index xI=0; xI < Xs.size(); xI++)
    {
        if(xI==Index_of_hI_within_scope)
            continue; //xI points not to a neighbor, but to this (hI) house
        if(Xs.at(xI) > 0)
            neighborIsBurning = true;
    }
    //bool neighborIsBurning = isNeighborBurning(s1, hI);

    Index sameLevel = curLevel;
    Index higherLevel = min((size_t)sameLevel+1, _m_nrFireLevels-1);
    Index lowerLevel = (curLevel==0) ? 0 : (curLevel-1);
    double p2=0.0;// the prob. factor of ThisHouseFirelevel;
    switch(nrAgentsAtLocation)
    {
        case(0): 
        {
            //this is kind of strange: when a house is not burning, but
            //its neigbhor is, it will increase its FL with p=0.8
            //but when it is already burning (and its neighbor is not), it 
            //increase with p=0.4...

            //fire is likely to increase
            if(neighborIsBurning)
            {
                if(nextLevel == sameLevel)
                    p2+=0.2;
                if(nextLevel == higherLevel)
                    p2+=0.8;
            }
            else if (curLevel == 0) //fire won't get ignited
            {
                if(0 == nextLevel)
                    p2=1.0;
                else //not possible so we can quit...
                    p2=0.0;
            }
            else //normal burning house
            {
                if(nextLevel == sameLevel)
                    p2+=0.6;
                if(nextLevel == higherLevel)
                    p2+=0.4;
            }
            break;
        }
        case(1): 
        {
            //fire is likely to decrease
            if(neighborIsBurning)
            {
                if(nextLevel == sameLevel)
                    p2+=0.4;
                if(nextLevel == lowerLevel) 
                    p2+=0.6; //.6 prob of extuinguishing 1 fl
            }
            else if (curLevel == 0) //fire won't get ignited
            {
                if(0 == nextLevel)
                    p2=1.0;
                else //not possible so we can quit...
                    p2=0.0;
            }
            else //normal burning house
            {
                if(nextLevel == sameLevel)
                    p2+=0.0;
                if(nextLevel == lowerLevel)
                    p2+=1.0;
            }
            break;
        }
        default: 
        {
#if 1
            //more than 1 agent: fire is extinguished
            if(0 == nextLevel)
                p2=1.0;
            else //not possible so we can quit...
                p2=0.0;
#else // made it depend on multipleAgentExtinguishProb
            if(0 == nextLevel)
                p2+=(GetMultipleAgentExtinguishProb());
            if(nextLevel == lowerLevel)
                p2+=(1-GetMultipleAgentExtinguishProb());
#endif
        }

        
    }
    return(p2);
}